

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O3

VariableType * __thiscall rsg::VariableType::getElementType(VariableType *this)

{
  Type baseType;
  VariableType *pVVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  baseType = this->m_baseType;
  if (baseType < TYPE_LAST) {
    if ((0xceU >> (baseType & 0x1f) & 1) != 0) {
      pVVar1 = getScalarType(baseType);
      return pVVar1;
    }
    if (baseType == TYPE_ARRAY) {
      return this->m_elementType;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"VariableType::getElementType(): unsupported type","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0218a298;
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const VariableType& VariableType::getElementType (void) const
{
	DE_ASSERT(m_precision == PRECISION_NONE); // \todo [pyry] Precision
	switch (m_baseType)
	{
		case TYPE_FLOAT:
		case TYPE_INT:
		case TYPE_BOOL:
		case TYPE_SAMPLER_2D:
		case TYPE_SAMPLER_CUBE:
			return getScalarType(m_baseType);

		case TYPE_ARRAY:
		{
			DE_ASSERT(m_elementType);
			return *m_elementType;
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("VariableType::getElementType(): unsupported type");
	}
}